

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ann.cpp
# Opt level: O0

double __thiscall ANN::accuracy(ANN *this,DataSet *dataSet)

{
  bool bVar1;
  vector<double,_std::allocator<double>_> *pvVar2;
  vector<double,_std::allocator<double>_> *vec2;
  double output;
  Matrix local_80;
  Matrix local_50;
  uint local_2c;
  uint uStack_28;
  uint i;
  uint local_20;
  uint local_1c;
  uint all_guesses;
  uint right_guesses;
  DataSet *dataSet_local;
  ANN *this_local;
  
  local_1c = 0;
  _all_guesses = dataSet;
  dataSet_local = (DataSet *)this;
  _uStack_28 = (anon_struct_8_2_de36e9ab_for_anon_union_8_2_1e237852_for_Shape_0_1)
               DataSet::shape(dataSet);
  local_20 = uStack_28;
  for (local_2c = 0; local_2c < local_20; local_2c = local_2c + 1) {
    pvVar2 = DataSet::get_input(_all_guesses,local_2c);
    feed_forward(&local_50,this,pvVar2);
    pvVar2 = Matrix::operator[](&local_50,0);
    output = DataSet::get_output(_all_guesses,local_2c);
    DataSet::one_hot_encode(&local_80,output,2);
    vec2 = Matrix::operator[](&local_80,0);
    bVar1 = is_same(pvVar2,vec2);
    Matrix::~Matrix(&local_80);
    Matrix::~Matrix(&local_50);
    if (bVar1) {
      local_1c = local_1c + 1;
    }
  }
  return (double)local_1c / (double)local_20;
}

Assistant:

double ANN::accuracy(const DataSet& dataSet){
    uint right_guesses=0;
    uint all_guesses=dataSet.shape().n_row;
    
    for(uint i=0;i<all_guesses;++i){
        if(is_same(feed_forward(dataSet.get_input(i))[0], DataSet::one_hot_encode(dataSet.get_output(i), 2)[0]))
            ++right_guesses;
    }

    return (double)right_guesses/all_guesses;
}